

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O1

void rgb_convert(j_compress_ptr cinfo,JSAMPARRAY input_buf,JSAMPIMAGE output_buf,
                JDIMENSION output_row,int num_rows)

{
  uint uVar1;
  JSAMPROW pJVar2;
  JSAMPROW pJVar3;
  JSAMPROW pJVar4;
  bool bVar5;
  ulong uVar6;
  JSAMPLE *pJVar7;
  
  if (0 < num_rows) {
    uVar1 = cinfo->image_width;
    do {
      if ((ulong)uVar1 != 0) {
        pJVar2 = (*output_buf)[output_row];
        pJVar3 = output_buf[1][output_row];
        pJVar4 = output_buf[2][output_row];
        pJVar7 = *input_buf;
        uVar6 = 0;
        do {
          pJVar2[uVar6] = *pJVar7;
          pJVar3[uVar6] = pJVar7[1];
          pJVar4[uVar6] = pJVar7[2];
          pJVar7 = pJVar7 + 3;
          uVar6 = uVar6 + 1;
        } while (uVar1 != uVar6);
      }
      input_buf = input_buf + 1;
      output_row = output_row + 1;
      bVar5 = 1 < num_rows;
      num_rows = num_rows + -1;
    } while (bVar5);
  }
  return;
}

Assistant:

METHODDEF(void)
rgb_convert (j_decompress_ptr cinfo,
	     JSAMPIMAGE input_buf, JDIMENSION input_row,
	     JSAMPARRAY output_buf, int num_rows)
{
  register JSAMPROW outptr;
  register JSAMPROW inptr0, inptr1, inptr2;
  register JDIMENSION col;
  JDIMENSION num_cols = cinfo->output_width;

  while (--num_rows >= 0) {
    inptr0 = input_buf[0][input_row];
    inptr1 = input_buf[1][input_row];
    inptr2 = input_buf[2][input_row];
    input_row++;
    outptr = *output_buf++;
    for (col = 0; col < num_cols; col++) {
      /* We can dispense with GETJSAMPLE() here */
      outptr[RGB_RED]   = inptr0[col];
      outptr[RGB_GREEN] = inptr1[col];
      outptr[RGB_BLUE]  = inptr2[col];
      outptr += RGB_PIXELSIZE;
    }
  }
}